

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::BitStringOrOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  long lVar10;
  unsigned_long *puVar11;
  idx_t iVar12;
  unsigned_long *puVar13;
  unsigned_long *puVar14;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_90;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar11 = (unsigned_long *)0x0;
      uVar9 = 0;
      puVar13 = (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      local_78.data = (data_ptr_t)&input->validity;
      do {
        puVar14 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar14 == (unsigned_long *)0x0) {
          puVar14 = puVar13 + 8;
          if (count <= puVar13 + 8) {
            puVar14 = (unsigned_long *)count;
          }
joined_r0x00dca079:
          while (puVar8 = puVar11, puVar5 = puVar11,
                puVar6 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
                puVar11 < puVar14) {
            BitwiseOperation::
            Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
                      ((BitState<duckdb::string_t> *)state,
                       (string_t *)(pdVar1 + (long)puVar11 * 0x10),(AggregateUnaryInput *)&local_78)
            ;
            puVar11 = (unsigned_long *)
                      ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + 1);
            local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar11;
          }
        }
        else {
          uVar2 = puVar14[uVar9];
          puVar14 = puVar13 + 8;
          if (count <= puVar13 + 8) {
            puVar14 = (unsigned_long *)count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x00dca079;
          puVar8 = puVar14;
          puVar5 = puVar14;
          puVar6 = puVar14;
          puVar7 = puVar13;
          puVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (uVar2 != 0) {
            while (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                        puVar7,
                  puVar8 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask, puVar5 = puVar11, puVar6 = puVar4,
                  local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask <
                  puVar14) {
              if ((uVar2 >> ((ulong)(uint)((int)local_78.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar13) & 0x3f) & 1) != 0) {
                lVar10 = (long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask * 0x10;
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
                BitwiseOperation::
                Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
                          ((BitState<duckdb::string_t> *)state,(string_t *)(pdVar1 + lVar10),
                           (AggregateUnaryInput *)&local_78);
              }
              puVar11 = (unsigned_long *)
                        ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask + 1);
              puVar4 = puVar11;
              puVar7 = puVar11;
            }
          }
        }
        local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        puVar11 = puVar5;
        uVar9 = uVar9 + 1;
        puVar13 = puVar8;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar11 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar11 == (unsigned_long *)0x0) || ((*puVar11 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      BitwiseOperation::
      Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
                ((BitState<duckdb::string_t> *)state,(string_t *)input->data,
                 (AggregateUnaryInput *)&local_78);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    local_90.input_mask = &local_78.validity;
    local_90.input = aggr_input_data;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        iVar12 = 0;
        do {
          local_90.input_idx = iVar12;
          if (psVar3 != (sel_t *)0x0) {
            local_90.input_idx = (idx_t)psVar3[iVar12];
          }
          BitwiseOperation::
          Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
                    ((BitState<duckdb::string_t> *)state,
                     (string_t *)(local_78.data + local_90.input_idx * 0x10),&local_90);
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      iVar12 = 0;
      do {
        local_90.input_idx = iVar12;
        if (psVar3 != (sel_t *)0x0) {
          local_90.input_idx = (idx_t)psVar3[iVar12];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_90.input_idx >> 6] >> (local_90.input_idx & 0x3f) & 1) != 0)) {
          BitwiseOperation::
          Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
                    ((BitState<duckdb::string_t> *)state,
                     (string_t *)(local_78.data + local_90.input_idx * 0x10),&local_90);
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}